

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt2obj.cpp
# Opt level: O2

void pbrt::writeTriangleMesh(SP *mesh,affine3f *xfm)

{
  element_type *peVar1;
  pointer pvVar2;
  pointer pvVar3;
  ostream *poVar4;
  pointer pvVar5;
  pointer pvVar6;
  vec3f local_48;
  SP *local_38;
  
  peVar1 = (mesh->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar2 = (peVar1->vertex).
           super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_38 = mesh;
  for (pvVar6 = (peVar1->vertex).
                super__Vector_base<pbrt::math::vec3f,_std::allocator<pbrt::math::vec3f>_>._M_impl.
                super__Vector_impl_data._M_start; pvVar6 != pvVar2; pvVar6 = pvVar6 + 1) {
    local_48 = *pvVar6;
    local_48 = math::operator*(xfm,&local_48);
    poVar4 = std::operator<<((ostream *)out,"v  ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48.x);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48.y);
    poVar4 = std::operator<<(poVar4," ");
    poVar4 = (ostream *)std::ostream::operator<<(poVar4,local_48.z);
    std::endl<char,std::char_traits<char>>(poVar4);
    numVerticesWritten = numVerticesWritten + 1;
  }
  peVar1 = (local_38->super___shared_ptr<pbrt::TriangleMesh,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pvVar3 = (peVar1->index).super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pvVar5 = (peVar1->index).
                super__Vector_base<pbrt::math::vec3i,_std::allocator<pbrt::math::vec3i>_>._M_impl.
                super__Vector_impl_data._M_start; pvVar5 != pvVar3; pvVar5 = pvVar5 + 1) {
    poVar4 = std::operator<<((ostream *)out,"f ");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"\t");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    poVar4 = std::operator<<(poVar4,"\t");
    poVar4 = std::ostream::_M_insert<unsigned_long>((ulong)poVar4);
    std::endl<char,std::char_traits<char>>(poVar4);
  }
  numWritten = numWritten + 1;
  return;
}

Assistant:

void writeTriangleMesh(TriangleMesh::SP mesh, const affine3f &xfm)
  {
    /* TODO: export the material of that shape, and use it */
    size_t firstVertexID = numVerticesWritten+1;

    /* TODO: ignoring texture coordinates for now */

    /* TODO: ignoring shading normals for now */

    for (auto v : mesh->vertex) {
      v = xfmPoint(xfm,v);
      out << "v  " << v.x << " " << v.y << " " << v.z << std::endl;
      numVerticesWritten++;
    }

    for (auto v : mesh->index) {
      /* TODO : for texcoord and normal arrays, use x//x an x/x/x formats */
      out << "f " << (firstVertexID+v.x)
          << "\t" << (firstVertexID+v.y)
          << "\t" << (firstVertexID+v.z)
          << std::endl;
    }
    numWritten++;
  }